

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O1

CScript * __thiscall
anon_unknown.dwarf_28929c1::CScriptVisitor::operator()
          (CScript *__return_storage_ptr__,CScriptVisitor *this,WitnessUnknown *id)

{
  uint uVar1;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  opcodetype opcode;
  long in_FS_OFFSET;
  undefined1 local_38 [28];
  uint uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = 0;
  stack0xffffffffffffffe0 = 0;
  local_38._0_8_ = (char *)0x0;
  local_38._8_8_ = 0;
  uVar1 = *(uint *)this;
  if (0x10 < uVar1) {
    __assert_fail("n >= 0 && n <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/script.h"
                  ,0x203,"static opcodetype CScript::EncodeOP_N(int)");
  }
  opcode = uVar1 + OP_RESERVED;
  if (uVar1 == 0) {
    opcode = OP_0;
  }
  this_00 = CScript::operator<<((CScript *)local_38,opcode);
  other = &CScript::operator<<(this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       (this + 8))->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&__return_storage_ptr__->super_CScriptBase,other);
  if (0x1c < uStack_1c) {
    free((void *)local_38._0_8_);
    local_38._0_8_ = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript operator()(const WitnessUnknown& id) const
    {
        return CScript() << CScript::EncodeOP_N(id.GetWitnessVersion()) << id.GetWitnessProgram();
    }